

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

void P_SpawnSkybox(ASkyViewpoint *origin)

{
  line_t_conflict *plVar1;
  uint pnum;
  sector_t_conflict *psVar2;
  ulong uVar3;
  ushort uVar4;
  DVector2 local_28;
  
  psVar2 = (sector_t_conflict *)(origin->super_AActor).Sector;
  if (psVar2 == (sector_t_conflict *)0x0) {
    Printf("Sector not initialized for SkyCamCompat\n");
    local_28.X = (origin->super_AActor).__Pos.X;
    local_28.Y = (origin->super_AActor).__Pos.Y;
    psVar2 = P_PointInSector(&local_28);
    (origin->super_AActor).Sector = (sector_t *)psVar2;
    if (psVar2 == (sector_t_conflict *)0x0) {
      return;
    }
  }
  uVar3 = 0;
  uVar4 = (ushort)*(undefined4 *)&psVar2->linecount;
  if ((short)uVar4 < 1) {
    uVar4 = 0;
  }
  while( true ) {
    if (uVar4 == uVar3) {
      return;
    }
    plVar1 = psVar2->lines[uVar3];
    if ((plVar1->special == 0x39) && (plVar1->args[1] == 2)) break;
    uVar3 = uVar3 + 1;
  }
  pnum = P_GetSkyboxPortal(origin);
  CopyPortal(plVar1->args[0],plVar1->args[2],pnum,0.0,SUB81(uVar3,0));
  return;
}

Assistant:

void P_SpawnSkybox(ASkyViewpoint *origin)
{
	sector_t *Sector = origin->Sector;
	if (Sector == NULL)
	{
		Printf("Sector not initialized for SkyCamCompat\n");
		origin->Sector = Sector = P_PointInSector(origin->Pos());
	}
	if (Sector)
	{
		line_t * refline = NULL;
		for (short i = 0; i < Sector->linecount; i++)
		{
			refline = Sector->lines[i];
			if (refline->special == Sector_SetPortal && refline->args[1] == 2)
			{
				// We found the setup linedef for this skybox, so let's use it for our init.
				unsigned pnum = P_GetSkyboxPortal(origin);
				CopyPortal(refline->args[0], refline->args[2], pnum, 0, true);
				return;
			}
		}
	}
}